

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O0

int XLearnGetTrain(XL *out,string *train_path)

{
  HyperParam *pHVar1;
  string *in_RSI;
  undefined8 *in_RDI;
  runtime_error *_except_;
  XLearn *xl;
  
  pHVar1 = XLearn::GetHyperParam((XLearn *)*in_RDI);
  std::__cxx11::string::operator=(in_RSI,(string *)&pHVar1->train_set_file);
  return 0;
}

Assistant:

XL_DLL int XLearnGetTrain(XL *out, std::string& train_path) {
  API_BEGIN();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  train_path = xl->GetHyperParam().train_set_file;
  API_END();
}